

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.cc
# Opt level: O1

bool testing::internal::ParseGoogleMockIntFlag(char *str,char *flag,int32_t *value)

{
  bool bVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  char *str_00;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_18;
  
  local_18._M_head_impl = in_RAX;
  str_00 = ParseGoogleMockFlagValue(str,"default_mock_behavior",true);
  if (str_00 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    Message::Message((Message *)&local_18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_18._M_head_impl + 0x10),"The value of flag --",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_18._M_head_impl + 0x10),"default_mock_behavior",0x15);
    bVar1 = ParseInt32((Message *)&local_18,str_00,&FLAGS_gmock_default_mock_behavior);
    if (local_18._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_18._M_head_impl + 8))();
    }
  }
  return bVar1;
}

Assistant:

static bool ParseGoogleMockIntFlag(const char* str, const char* flag,
                                   int32_t* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseGoogleMockFlagValue(str, flag, true);

  // Aborts if the parsing failed.
  if (value_str == nullptr) return false;

  // Sets *value to the value of the flag.
  return ParseInt32(Message() << "The value of flag --" << flag,
                    value_str, value);
}